

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode UA_Server_delayedCallback(UA_Server *server,UA_ServerCallback callback,void *data)

{
  UA_DelayedJob *pUVar1;
  UA_DelayedJob *dj;
  void *data_local;
  UA_ServerCallback callback_local;
  UA_Server *server_local;
  
  pUVar1 = (UA_DelayedJob *)malloc(0x28);
  if (pUVar1 == (UA_DelayedJob *)0x0) {
    server_local._4_4_ = 0x80030000;
  }
  else {
    (pUVar1->job).type = UA_JOBTYPE_METHODCALL;
    (pUVar1->job).job.methodCall.data = data;
    (pUVar1->job).job.methodCall.method = callback;
    (pUVar1->next).sle_next = (server->delayedCallbacks).slh_first;
    (server->delayedCallbacks).slh_first = pUVar1;
    server_local._4_4_ = 0;
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Server_delayedCallback(UA_Server *server, UA_ServerCallback callback, void *data) {
    UA_DelayedJob *dj = UA_malloc(sizeof(UA_DelayedJob));
    if(!dj)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    dj->job.type = UA_JOBTYPE_METHODCALL;
    dj->job.job.methodCall.data = data;
    dj->job.job.methodCall.method = callback;
    SLIST_INSERT_HEAD(&server->delayedCallbacks, dj, next);
    return UA_STATUSCODE_GOOD;
}